

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitDestructuredObjectMember
               (ParseNodePtr memberNode,RegSlot rhsLocation,RegSlot propIdArrLocation,
               RegSlot computedPropIdArrLocation,uint32 *computedIndex,bool hasRest,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R0;
  undefined4 *puVar3;
  ParseNodeBin *pPVar4;
  ByteCodeWriter *pBVar5;
  ParseNodeUni *pPVar6;
  ParseNodeVar *pPVar7;
  ParseNodePtr local_40;
  ParseNodePtr init;
  ParseNodePtr lhsElementNode;
  RegSlot nameLocation;
  bool hasRest_local;
  uint32 *computedIndex_local;
  RegSlot computedPropIdArrLocation_local;
  RegSlot propIdArrLocation_local;
  RegSlot rhsLocation_local;
  ParseNodePtr memberNode_local;
  
  if ((memberNode->nop != knopObjectPatternMember) && (memberNode->nop != knopEllipsis)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1b93,
                       "(memberNode->nop == knopObjectPatternMember || memberNode->nop == knopEllipsis)"
                       ,
                       "memberNode->nop == knopObjectPatternMember || memberNode->nop == knopEllipsis"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  R0 = FuncInfo::AcquireTmpRegister(funcInfo);
  if (memberNode->nop == knopObjectPatternMember) {
    pPVar4 = ParseNode::AsParseNodeBin(memberNode);
    EmitNameInvoke(R0,rhsLocation,computedPropIdArrLocation,computedIndex,hasRest,pPVar4->pnode1,
                   byteCodeGenerator,funcInfo);
    pPVar4 = ParseNode::AsParseNodeBin(memberNode);
    init = pPVar4->pnode2;
  }
  else {
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar5,NewScObjectSimple,R0);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg4
              (pBVar5,Restify,rhsLocation,R0,propIdArrLocation,computedPropIdArrLocation);
    pPVar6 = ParseNode::AsParseNodeUni(memberNode);
    init = pPVar6->pnode1;
  }
  local_40 = (ParseNodePtr)0x0;
  bVar2 = ParseNode::IsVarLetOrConst(init);
  if (bVar2) {
    pPVar7 = ParseNode::AsParseNodeVar(init);
    local_40 = pPVar7->pnodeInit;
  }
  else if (init->nop == knopAsg) {
    pPVar4 = ParseNode::AsParseNodeBin(init);
    local_40 = pPVar4->pnode2;
    pPVar4 = ParseNode::AsParseNodeBin(init);
    init = pPVar4->pnode1;
  }
  EmitDestructuredValueOrInitializer(init,R0,local_40,false,byteCodeGenerator,funcInfo);
  FuncInfo::ReleaseTmpRegister(funcInfo,R0);
  return;
}

Assistant:

void EmitDestructuredObjectMember(ParseNodePtr memberNode,
    Js::RegSlot rhsLocation,
    Js::RegSlot propIdArrLocation,
    Js::RegSlot computedPropIdArrLocation,
    uint32 *computedIndex,
    bool hasRest,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    Assert(memberNode->nop == knopObjectPatternMember || memberNode->nop == knopEllipsis);

    Js::RegSlot nameLocation = funcInfo->AcquireTmpRegister();
    ParseNodePtr lhsElementNode = nullptr;

    if (memberNode->nop == knopObjectPatternMember)
    {
        EmitNameInvoke(nameLocation, rhsLocation, computedPropIdArrLocation, 
            computedIndex, hasRest, memberNode->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo);

        // Imagine we are transforming
        // {x:x1} = {} to x1 = {}.x  (here x1 is the second node of the member but that is our lhsnode)

        lhsElementNode = memberNode->AsParseNodeBin()->pnode2;
    }
    else
    {
        // memberNode->nop == knopEllipsis, aka we are performing Rest operation
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::NewScObjectSimple, nameLocation);
        byteCodeGenerator->Writer()->Reg4(Js::OpCode::Restify, rhsLocation, nameLocation, propIdArrLocation, computedPropIdArrLocation);
        lhsElementNode = memberNode->AsParseNodeUni()->pnode1;
    }

    ParseNodePtr init = nullptr;
    if (lhsElementNode->IsVarLetOrConst())
    {
        init = lhsElementNode->AsParseNodeVar()->pnodeInit;
    }
    else if (lhsElementNode->nop == knopAsg)
    {
        init = lhsElementNode->AsParseNodeBin()->pnode2;
        lhsElementNode = lhsElementNode->AsParseNodeBin()->pnode1;
    }

    EmitDestructuredValueOrInitializer(lhsElementNode, nameLocation, init, false /*isNonPatternAssignmentTarget*/, byteCodeGenerator, funcInfo);

    funcInfo->ReleaseTmpRegister(nameLocation);
}